

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void PerfomanceTester<unsigned_long_long,_void>::Test(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[");
  poVar1 = std::operator<<(poVar1,_operator<< + (*_operator<< == '*'));
  poVar1 = std::operator<<(poVar1,"] skipped");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void Test()
    {
        std::cerr << "[" << typeid(T).name() << "] skipped" << std::endl;
    }